

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::TSPI_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,TSPI_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pcVar3;
  KFLOAT32 KVar4;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_2a0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  TSPI_PDU *local_18;
  TSPI_PDU *this_local;
  
  local_18 = this;
  this_local = (TSPI_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  LE_Header::GetAsString_abi_cxx11_(&local_1c0,&this->super_LE_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Time Space Position Information(TSPI) PDU-\n");
  poVar2 = std::operator<<(poVar2,"Optional Field Flags:\n");
  poVar2 = std::operator<<(poVar2,"\tLinear Velocity:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_TSPIFlagUnion).m_ui8Flag & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tLinear Orientation:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_TSPIFlagUnion).m_ui8Flag >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tPosition Error:           ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_TSPIFlagUnion).m_ui8Flag >> 2 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tOrientation Error:        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_TSPIFlagUnion).m_ui8Flag >> 3 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tDead Reckoning Parameter: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_TSPIFlagUnion).m_ui8Flag >> 4 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tMeasured Speed:           ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_TSPIFlagUnion).m_ui8Flag >> 5 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tSystem Specific Data:     ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_TSPIFlagUnion).m_ui8Flag >> 6 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Location - ");
  DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_1f0,&this->m_Loc);
  std::operator<<(poVar2,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (((this->m_TSPIFlagUnion).m_ui8Flag & 1) != 0) {
    poVar2 = std::operator<<(local_190,"Linear Velocity:          ");
    DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
              (&local_210,&this->m_LinVel);
    std::operator<<(poVar2,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 1 & 1) != 0) {
    poVar2 = std::operator<<(local_190,"Linear Orientation:       ");
    DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_(&local_230,&this->m_Ori);
    std::operator<<(poVar2,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 2 & 1) != 0) {
    poVar2 = std::operator<<(local_190,"Position Error:           ");
    DATA_TYPE::PositionError::GetAsString_abi_cxx11_(&local_250,&this->m_PosErr);
    std::operator<<(poVar2,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 3 & 1) != 0) {
    poVar2 = std::operator<<(local_190,"Orientation Error:        ");
    DATA_TYPE::OrientationError::GetAsString_abi_cxx11_(&local_270,&this->m_OriErr);
    std::operator<<(poVar2,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 4 & 1) != 0) {
    DATA_TYPE::LE_DeadReckoningParameter::GetAsString_abi_cxx11_
              ((KString *)&citr,&this->m_DeadReckoningParameter);
    std::operator<<(local_190,(string *)&citr);
    std::__cxx11::string::~string((string *)&citr);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 5 & 1) != 0) {
    poVar2 = std::operator<<(local_190,"Measured Speed:           ");
    KVar4 = DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_MeasureSpd);
    std::ostream::operator<<(poVar2,(float)KVar4);
  }
  if (((this->m_TSPIFlagUnion).m_ui8Flag >> 6 & 1) != 0) {
    poVar2 = std::operator<<(local_190,"System Specific Data:\n");
    poVar2 = std::operator<<(poVar2,"\tData Length: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8SSDLen);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"\tData: ");
    citrEnd = std::vector<char,_std::allocator<char>_>::begin(&this->m_vSSD);
    local_2a0._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_vSSD);
    while (bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_2a0), bVar1) {
      poVar2 = (ostream *)std::ostream::operator<<(local_190,std::hex);
      pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&citrEnd);
      std::operator<<(poVar2,*pcVar3);
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(&citrEnd);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString TSPI_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-Time Space Position Information(TSPI) PDU-\n"
       << "Optional Field Flags:\n"
       << "\tLinear Velocity:          " << ( KUINT16 )m_TSPIFlagUnion.m_ui8LinVel << "\n"
       << "\tLinear Orientation:       " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Ori    << "\n"
       << "\tPosition Error:           " << ( KUINT16 )m_TSPIFlagUnion.m_ui8PosErr << "\n"
       << "\tOrientation Error:        " << ( KUINT16 )m_TSPIFlagUnion.m_ui8OriErr << "\n"
       << "\tDead Reckoning Parameter: " << ( KUINT16 )m_TSPIFlagUnion.m_ui8DRM    << "\n"
       << "\tMeasured Speed:           " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Spd    << "\n"
       << "\tSystem Specific Data:     " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Data   << "\n"
       << "Location - "                << m_Loc.GetAsString();

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        ss << "Linear Velocity:          " << m_LinVel.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        ss << "Linear Orientation:       " << m_Ori.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        ss << "Position Error:           " << m_PosErr.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        ss << "Orientation Error:        " << m_OriErr.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        ss << m_DeadReckoningParameter.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        ss << "Measured Speed:           " << m_MeasureSpd.GetAsFloat32();
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        ss  << "System Specific Data:\n"
            << "\tData Length: "    << ( KUINT16 )m_ui8SSDLen << "\n"
            << "\tData: ";

        vector<KOCTET>::const_iterator citr = m_vSSD.begin();
        vector<KOCTET>::const_iterator citrEnd = m_vSSD.end();
        for( ; citr != citrEnd; ++citr )
        {
            ss << hex << *citr;
        }
    }

    return ss.str();
}